

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall
wallet::CWallet::ChangeWalletPassphrase
          (CWallet *this,SecureString *strOldWalletPassphrase,SecureString *strNewWalletPassphrase)

{
  uint *params;
  _Rb_tree_header *p_Var1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  _Base_ptr p_Var7;
  long lVar8;
  long lVar9;
  WalletDatabase *pWVar10;
  byte bVar11;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> salt;
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  span<const_unsigned_char,_18446744073709551615UL> salt_01;
  span<const_unsigned_char,_18446744073709551615UL> salt_02;
  span<const_unsigned_char,_18446744073709551615UL> ciphertext;
  WalletBatch local_b8;
  CKeyingMaterial _vMasterKey;
  CCrypter crypter;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = IsLocked(this);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&this->m_relock_mutex,"m_relock_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,0x25b,false);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,0x25b,false);
  Lock(this);
  CCrypter::CCrypter(&crypter);
  _vMasterKey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _vMasterKey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  _vMasterKey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var7 = (this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7)) {
    salt._M_extent._M_extent_value = (long)p_Var7[2]._M_parent - (long)*(pointer *)(p_Var7 + 2);
    salt._M_ptr = *(pointer *)(p_Var7 + 2);
    bVar4 = CCrypter::SetKeyFromPassphrase
                      (&crypter,strOldWalletPassphrase,salt,*(uint *)((long)&p_Var7[2]._M_right + 4)
                       ,*(uint *)&p_Var7[2]._M_right);
    if (!bVar4) break;
    ciphertext._M_extent._M_extent_value = (long)p_Var7[1]._M_left - (long)p_Var7[1]._M_parent;
    ciphertext._M_ptr = (pointer)p_Var7[1]._M_parent;
    bVar4 = CCrypter::Decrypt(&crypter,ciphertext,&_vMasterKey);
    if (!bVar4) break;
    bVar4 = Unlock(this,&_vMasterKey);
    if (bVar4) {
      lVar8 = std::chrono::_V2::steady_clock::now();
      salt_00._M_extent._M_extent_value = (long)p_Var7[2]._M_parent - (long)*(pointer *)(p_Var7 + 2)
      ;
      salt_00._M_ptr = *(pointer *)(p_Var7 + 2);
      CCrypter::SetKeyFromPassphrase
                (&crypter,strNewWalletPassphrase,salt_00,*(uint *)((long)&p_Var7[2]._M_right + 4),
                 *(uint *)&p_Var7[2]._M_right);
      uVar5 = *(uint *)((long)&p_Var7[2]._M_right + 4);
      lVar9 = std::chrono::_V2::steady_clock::now();
      *(int *)((long)&p_Var7[2]._M_right + 4) =
           (int)(long)(((double)uVar5 * 100.0 * 1000000.0) / (double)(lVar9 - lVar8));
      lVar8 = std::chrono::_V2::steady_clock::now();
      salt_01._M_extent._M_extent_value = (long)p_Var7[2]._M_parent - (long)*(pointer *)(p_Var7 + 2)
      ;
      salt_01._M_ptr = *(pointer *)(p_Var7 + 2);
      CCrypter::SetKeyFromPassphrase
                (&crypter,strNewWalletPassphrase,salt_01,*(uint *)((long)&p_Var7[2]._M_right + 4),
                 *(uint *)&p_Var7[2]._M_right);
      params = (uint *)((long)&p_Var7[2]._M_right + 4);
      uVar5 = *params;
      lVar9 = std::chrono::_V2::steady_clock::now();
      uVar5 = (int)(long)(((double)uVar5 * 100.0 * 1000000.0) / (double)(lVar9 - lVar8)) + uVar5;
      uVar6 = 25000;
      if (49999 < uVar5) {
        uVar6 = uVar5 >> 1;
      }
      *params = uVar6;
      WalletLogPrintf<unsigned_int>(this,(ConstevalFormatString<1U>)0x6e42ae,params);
      salt_02._M_extent._M_extent_value = (long)p_Var7[2]._M_parent - (long)*(pointer *)(p_Var7 + 2)
      ;
      salt_02._M_ptr = *(pointer *)(p_Var7 + 2);
      bVar4 = CCrypter::SetKeyFromPassphrase
                        (&crypter,strNewWalletPassphrase,salt_02,
                         *(uint *)((long)&p_Var7[2]._M_right + 4),*(uint *)&p_Var7[2]._M_right);
      if (bVar4) {
        bVar4 = CCrypter::Encrypt(&crypter,&_vMasterKey,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &p_Var7[1]._M_parent);
        if (bVar4) {
          pWVar10 = GetDatabase(this);
          (*pWVar10->_vptr_WalletDatabase[0xe])(&local_b8,pWVar10,1);
          local_b8.m_database = pWVar10;
          WalletBatch::WriteMasterKey
                    (&local_b8,p_Var7[1]._M_color,(CMasterKey *)&p_Var7[1]._M_parent);
          if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)
              local_b8.m_batch._M_t.
              super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
              .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
              (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
            (*(*(_func_int ***)
                local_b8.m_batch._M_t.
                super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                ._M_t.
                super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
          }
          bVar11 = 1;
          if (bVar3) {
            Lock(this);
          }
          goto LAB_0045894c;
        }
      }
      break;
    }
  }
  bVar11 = 0;
LAB_0045894c:
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
            (&_vMasterKey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>);
  CCrypter::~CCrypter(&crypter);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (bool)((_Rb_tree_header *)p_Var7 != p_Var1 & bVar11);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::ChangeWalletPassphrase(const SecureString& strOldWalletPassphrase, const SecureString& strNewWalletPassphrase)
{
    bool fWasLocked = IsLocked();

    {
        LOCK2(m_relock_mutex, cs_wallet);
        Lock();

        CCrypter crypter;
        CKeyingMaterial _vMasterKey;
        for (MasterKeyMap::value_type& pMasterKey : mapMasterKeys)
        {
            if(!crypter.SetKeyFromPassphrase(strOldWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod))
                return false;
            if (!crypter.Decrypt(pMasterKey.second.vchCryptedKey, _vMasterKey))
                return false;
            if (Unlock(_vMasterKey))
            {
                constexpr MillisecondsDouble target{100};
                auto start{SteadyClock::now()};
                crypter.SetKeyFromPassphrase(strNewWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod);
                pMasterKey.second.nDeriveIterations = static_cast<unsigned int>(pMasterKey.second.nDeriveIterations * target / (SteadyClock::now() - start));

                start = SteadyClock::now();
                crypter.SetKeyFromPassphrase(strNewWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod);
                pMasterKey.second.nDeriveIterations = (pMasterKey.second.nDeriveIterations + static_cast<unsigned int>(pMasterKey.second.nDeriveIterations * target / (SteadyClock::now() - start))) / 2;

                if (pMasterKey.second.nDeriveIterations < 25000)
                    pMasterKey.second.nDeriveIterations = 25000;

                WalletLogPrintf("Wallet passphrase changed to an nDeriveIterations of %i\n", pMasterKey.second.nDeriveIterations);

                if (!crypter.SetKeyFromPassphrase(strNewWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod))
                    return false;
                if (!crypter.Encrypt(_vMasterKey, pMasterKey.second.vchCryptedKey))
                    return false;
                WalletBatch(GetDatabase()).WriteMasterKey(pMasterKey.first, pMasterKey.second);
                if (fWasLocked)
                    Lock();
                return true;
            }
        }
    }

    return false;
}